

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetLinkDepends
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language)

{
  pointer pcVar1;
  pointer pEVar2;
  bool *pbVar3;
  unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
  uVar4;
  PolicyStatus PVar5;
  cmValue cVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pbVar7;
  string_view arg;
  EvaluatedTargetPropertyEntry local_1d0;
  cmLinkImplItem *local_198;
  element_type *local_190;
  undefined1 local_188 [48];
  element_type *local_158;
  unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
  entry;
  EvaluatedTargetPropertyEntries entries;
  string local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueOptions;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uniqueOptions._M_h._M_buckets = &uniqueOptions._M_h._M_single_bucket;
  uniqueOptions._M_h._M_bucket_count = 1;
  uniqueOptions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  uniqueOptions._M_h._M_element_count = 0;
  uniqueOptions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  uniqueOptions._M_h._M_rehash_policy._M_next_resize = 0;
  uniqueOptions._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_188._40_8_ = config;
  local_158 = (element_type *)language;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"LINK_DEPENDS","");
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,this,&local_120,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  entries.Entries.
  super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  entries.Entries.
  super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  entries.HadContextSensitiveCondition = false;
  entries.Entries.
  super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  entries.Entries.
  super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  entries.Entries.
  super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_1d0.LinkImplItem =
       (cmLinkImplItem *)
       ((long)&local_1d0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace> + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"LINK_DEPENDS","");
  cVar6 = GetProperty(this,(string *)&local_1d0);
  if (local_1d0.LinkImplItem !=
      (cmLinkImplItem *)
      ((long)&local_1d0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace> + 8U))
  {
    operator_delete(local_1d0.LinkImplItem,
                    (ulong)((long)&(local_1d0.Backtrace.
                                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                    TopEntry.
                                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (cVar6.Value != (string *)0x0) {
    arg._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar6.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_(&depends,arg,false);
    if (depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar7 = depends.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar1 = (pbVar7->_M_dataplus)._M_p;
        local_198 = (cmLinkImplItem *)local_188;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,pcVar1,pcVar1 + pbVar7->_M_string_length);
        local_188._16_8_ = (pointer)0x0;
        local_188._24_8_ = (pointer)0x0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                  ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)((long)local_188 + 0x10))
        ;
        local_1d0.LinkImplItem =
             (cmLinkImplItem *)
             ((long)&local_1d0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
             + 8);
        if (local_198 == (cmLinkImplItem *)local_188) {
          local_1d0.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_188._8_8_;
        }
        else {
          local_1d0.LinkImplItem = local_198;
        }
        local_1d0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._1_7_ = local_188._1_7_;
        local_1d0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._0_1_ = local_188[0];
        local_1d0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_190;
        local_190 = (element_type *)0x0;
        local_188[0] = 0;
        local_1d0.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_188._16_8_;
        local_1d0.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_188._24_8_;
        local_188._16_8_ = 0;
        local_188._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_198 = (cmLinkImplItem *)local_188;
        CreateTargetPropertyEntry
                  ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&entry,SUB81(&local_1d0,0));
        if (local_1d0.Values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_1d0.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (local_1d0.LinkImplItem !=
            (cmLinkImplItem *)
            ((long)&local_1d0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace> +
            8U)) {
          operator_delete(local_1d0.LinkImplItem,
                          (ulong)((long)&(local_1d0.Backtrace.
                                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                          .TopEntry.
                                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._24_8_);
        }
        if (local_198 != (cmLinkImplItem *)local_188) {
          operator_delete(local_198,CONCAT71(local_188._1_7_,local_188[0]) + 1);
        }
        uVar4._M_t.
        super___uniq_ptr_impl<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
        .super__Head_base<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_false>._M_head_impl =
             entry._M_t.
             super___uniq_ptr_impl<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
             .super__Head_base<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_false>._M_head_impl;
        anon_unknown.dwarf_1e075ee::EvaluateTargetPropertyEntry
                  (&local_1d0,this,(string *)local_188._40_8_,(string *)local_158,&dagChecker,
                   (TargetPropertyEntry *)
                   entry._M_t.
                   super___uniq_ptr_impl<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                   .super__Head_base<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_false>.
                   _M_head_impl);
        std::
        vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
        ::emplace_back<(anonymous_namespace)::EvaluatedTargetPropertyEntry>
                  (&entries.Entries,&local_1d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1d0.Values);
        if (local_1d0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1d0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                     TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        (**(code **)(*(long *)uVar4._M_t.
                              super___uniq_ptr_impl<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                              .
                              super__Head_base<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_false>
                              ._M_head_impl + 8))
                  (uVar4._M_t.
                   super___uniq_ptr_impl<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                   .super__Head_base<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_false>.
                   _M_head_impl);
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != depends.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
  }
  local_1d0.LinkImplItem =
       (cmLinkImplItem *)
       ((long)&local_1d0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace> + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"INTERFACE_LINK_DEPENDS","");
  PVar5 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0099);
  anon_unknown.dwarf_1e075ee::AddInterfaceEntries
            (this,(string *)local_188._40_8_,(string *)&local_1d0,(string *)local_158,&dagChecker,
             &entries,Yes,(uint)(PVar5 == NEW));
  if (local_1d0.LinkImplItem !=
      (cmLinkImplItem *)
      ((long)&local_1d0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace> + 8U))
  {
    operator_delete(local_1d0.LinkImplItem,
                    (ulong)((long)&(local_1d0.Backtrace.
                                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                    TopEntry.
                                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  anon_unknown.dwarf_1e075ee::processOptions
            (this,&entries,__return_storage_ptr__,&uniqueOptions,false,"link depends",None,false);
  pEVar2 = (pointer)CONCAT71(entries.Entries.
                             super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                             ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                             entries.Entries.
                             super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                             ._M_impl.super__Vector_impl_data._M_finish._0_1_);
  if (entries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_start != pEVar2) {
    this_00 = &(entries.Entries.
                super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                ._M_impl.super__Vector_impl_data._M_start)->Values;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_00);
      pbVar7 = (pointer)(((EvaluatedTargetPropertyEntry *)(this_00 + -1))->Backtrace).
                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
      if (pbVar7 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar7);
      }
      pbVar3 = (bool *)(this_00 + 1);
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&this_00[2].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
    } while ((pointer)(pbVar3 + 8) != pEVar2);
  }
  if (entries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(entries.Entries.
                    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT71(entries.Entries.
                             super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                             entries.Entries.
                             super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                    (long)entries.Entries.
                          super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&dagChecker.Seen._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
    operator_delete(dagChecker.Property._M_dataplus._M_p,
                    dagChecker.Property.field_2._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&uniqueOptions._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetLinkDepends(
  std::string const& config, std::string const& language) const
{
  std::vector<BT<std::string>> result;
  std::unordered_set<std::string> uniqueOptions;
  cmGeneratorExpressionDAGChecker dagChecker(this, "LINK_DEPENDS", nullptr,
                                             nullptr);

  EvaluatedTargetPropertyEntries entries;
  if (cmValue linkDepends = this->GetProperty("LINK_DEPENDS")) {
    std::vector<std::string> depends = cmExpandedList(*linkDepends);
    for (const auto& depend : depends) {
      std::unique_ptr<TargetPropertyEntry> entry =
        CreateTargetPropertyEntry(depend);
      entries.Entries.emplace_back(EvaluateTargetPropertyEntry(
        this, config, language, &dagChecker, *entry));
    }
  }
  AddInterfaceEntries(this, config, "INTERFACE_LINK_DEPENDS", language,
                      &dagChecker, entries, IncludeRuntimeInterface::Yes,
                      this->GetPolicyStatusCMP0099() == cmPolicies::NEW
                        ? LinkInterfaceFor::Link
                        : LinkInterfaceFor::Usage);

  processOptions(this, entries, result, uniqueOptions, false, "link depends",
                 OptionsParse::None);

  return result;
}